

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

string * amrex::trim(string *s,string *space)

{
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_type send;
  size_type sbegin;
  string local_48 [32];
  undefined8 local_28;
  long local_20;
  ulong local_18;
  
  local_18 = in_RDX;
  local_20 = std::__cxx11::string::find_first_not_of(in_RSI,in_RDX);
  if (local_20 == -1) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    local_28 = std::__cxx11::string::find_last_not_of(in_RSI,local_18);
    std::__cxx11::string::substr((ulong)local_48,(ulong)in_RSI);
    std::__cxx11::string::operator=(in_RSI,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string
amrex::trim(std::string s, std::string const& space)
{
    const auto sbegin = s.find_first_not_of(space);
    if (sbegin == std::string::npos) return std::string{};
    const auto send = s.find_last_not_of(space);
    s = s.substr(sbegin, send-sbegin+1);
    return s;
}